

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Mode __thiscall
Catch::Clara::Parser::handleMode
          (Parser *this,size_t i,char c,string *arg,
          vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens)

{
  logic_error *this_00;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *tokens_local;
  string *arg_local;
  char c_local;
  size_t i_local;
  Parser *this_local;
  
  switch(this->mode) {
  case None:
    this_local._4_4_ = handleNone(this,i,c);
    break;
  case MaybeShortOpt:
    this_local._4_4_ = handleMaybeShortOpt(this,i,c);
    break;
  case SlashOpt:
  case ShortOpt:
  case LongOpt:
    this_local._4_4_ = handleOpt(this,i,c,arg,tokens);
    break;
  case Positional:
    this_local._4_4_ = handlePositional(this,i,c,arg,tokens);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"Unknown mode");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return this_local._4_4_;
}

Assistant:

Mode handleMode( std::size_t i, char c, std::string const& arg, std::vector<Token>& tokens ) {
            switch( mode ) {
                case None: return handleNone( i, c );
                case MaybeShortOpt: return handleMaybeShortOpt( i, c );
                case ShortOpt:
                case LongOpt:
                case SlashOpt: return handleOpt( i, c, arg, tokens );
                case Positional: return handlePositional( i, c, arg, tokens );
                default: throw std::logic_error( "Unknown mode" );
            }
        }